

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O0

void Rwr_Trav2_rec(Rwr_Man_t *p,Rwr_Node_t *pNode,int *pVolume)

{
  Rwr_Node_t *pRVar1;
  int *pVolume_local;
  Rwr_Node_t *pNode_local;
  Rwr_Man_t *p_local;
  
  if (((*(uint *)&pNode->field_0xe >> 0x1e & 1) == 0) && (pNode->TravId != p->nTravIds)) {
    pNode->TravId = p->nTravIds;
    *pVolume = *pVolume + 1;
    pRVar1 = Rwr_Regular(pNode->p0);
    Rwr_Trav2_rec(p,pRVar1,pVolume);
    pRVar1 = Rwr_Regular(pNode->p1);
    Rwr_Trav2_rec(p,pRVar1,pVolume);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Adds one node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Rwr_Trav2_rec( Rwr_Man_t * p, Rwr_Node_t * pNode, int * pVolume )
{
    if ( pNode->fUsed || pNode->TravId == p->nTravIds )
        return;
    pNode->TravId = p->nTravIds;
    (*pVolume)++;
    Rwr_Trav2_rec( p, Rwr_Regular(pNode->p0), pVolume );
    Rwr_Trav2_rec( p, Rwr_Regular(pNode->p1), pVolume );
}